

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::auxBranchReactiveLoss(Graph *this,Vertex *v,double *sum)

{
  bool bVar1;
  Vertex *pVVar2;
  double dVar3;
  double dVar4;
  Edge *local_28;
  Edge *e;
  double *sum_local;
  Vertex *v_local;
  Graph *this_local;
  
  local_28 = Vertex::getEdgesList(v);
  while( true ) {
    if (local_28 == (Edge *)0x0) {
      return;
    }
    while( true ) {
      bVar1 = false;
      if (local_28 != (Edge *)0x0) {
        bVar1 = Edge::isClosed(local_28);
        bVar1 = !bVar1;
      }
      if (!bVar1) break;
      Edge::setActiveFlow(local_28,0.0);
      Edge::setReactiveFlow(local_28,0.0);
      Edge::setActiveLoss(local_28,0.0);
      Edge::setReactiveLoss(local_28,0.0);
      local_28 = Edge::getNext(local_28);
    }
    if (local_28 == (Edge *)0x0) break;
    pVVar2 = Edge::getDestiny(local_28);
    dVar3 = Vertex::getReactivePower(pVVar2);
    dVar4 = Edge::getReactiveLoss(local_28);
    *sum = dVar3 + dVar4 + *sum;
    pVVar2 = Edge::getDestiny(local_28);
    auxBranchReactiveLoss(this,pVVar2,sum);
    local_28 = Edge::getNext(local_28);
  }
  return;
}

Assistant:

void Graph::auxBranchReactiveLoss(Vertex *v, double &sum){
    for(Edge *e = v->getEdgesList(); e!=NULL; e = e->getNext()){

        //nao descer por arcos com chave aberta
        while(e!=NULL && e->isClosed() == false){

            //nao tem fluxo nem perda em arcos abertos
            e->setActiveFlow(0.0);
            e->setReactiveFlow(0.0);
            e->setActiveLoss(0.0);
            e->setReactiveLoss(0.0);

            e = e->getNext();
        }
        if(e==NULL)
            break;

        sum+= e->getDestiny()->getReactivePower() + e->getReactiveLoss();
        auxBranchReactiveLoss(e->getDestiny(), sum);
    }
}